

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall slang::ast::TypePrinter::appendMembers(TypePrinter *this,Scope *scope)

{
  Symbol *pSVar1;
  Type *type;
  Symbol *member;
  format_args args;
  string_view fmt;
  char *local_38;
  size_t local_30;
  
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"{","");
  if (scope->deferredMemberIndex != Invalid) {
    Scope::elaborate(scope);
  }
  for (pSVar1 = scope->firstMember; pSVar1 != (Symbol *)0x0; pSVar1 = pSVar1->nextInScope) {
    type = DeclaredType::getType((DeclaredType *)(pSVar1 + 1));
    append(this,type);
    local_30 = (pSVar1->name)._M_len;
    local_38 = (pSVar1->name)._M_str;
    args.field_1.values_ = (value<fmt::v11::context> *)&local_38;
    args.desc_ = 0xd;
    fmt.size_ = 4;
    fmt.data_ = " {};";
    ::fmt::v11::detail::vformat_to
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
               (locale_ref)0x0);
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"}","");
  return;
}

Assistant:

void TypePrinter::appendMembers(const Scope& scope) {
    buffer->append("{");
    for (auto& member : scope.members()) {
        auto& var = member.as<VariableSymbol>();
        append(var.getType());
        buffer->format(" {};", var.name);
    }
    buffer->append("}");
}